

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdconntable.c
# Opt level: O1

int InsertInStdResConnTable(StdResConnTableEntry_t *elem)

{
  char *__s1;
  StdResConnTableEntry_t *pSVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char cVar5;
  char *__format;
  char *pcVar6;
  StdResConnTableEntry_t *pSVar7;
  ulong uVar8;
  
  __s1 = elem->key;
  cVar5 = *__s1;
  if (cVar5 == '\0') {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    pcVar4 = __s1;
    do {
      pcVar4 = pcVar4 + 1;
      uVar2 = uVar2 * 0x10 + (int)cVar5;
      uVar2 = uVar2 & 0xfffffff ^ uVar2 >> 0x18 & 0xfffffff0;
      cVar5 = *pcVar4;
    } while (cVar5 != '\0');
    uVar2 = uVar2 % 0xa39;
  }
  uVar8 = (ulong)uVar2;
  pSVar1 = StdResTblBucket[uVar8];
  if (pSVar1 == (StdResConnTableEntry_t *)0x0) {
    elem->next = (_StdResConnTableEntry *)0x0;
LAB_00127157:
    StdResTblBucket[uVar8] = elem;
LAB_0012717a:
    iVar3 = 1;
  }
  else {
    iVar3 = strcmp(__s1,pSVar1->key);
    if (iVar3 < 1) {
      if (iVar3 < 0) {
        elem->next = pSVar1;
        goto LAB_00127157;
      }
      pcVar4 = elem->value;
      pcVar6 = pSVar1->value;
      __format = "ERROR duplicate key: InsertInStdResConnTable(\"%s\", \"%s\") - old(\"%s\" @%d)\n";
    }
    else {
      do {
        pSVar7 = pSVar1;
        pSVar1 = pSVar7->next;
        if (pSVar1 == (_StdResConnTableEntry *)0x0) {
          iVar3 = 1;
          break;
        }
        iVar3 = strcmp(__s1,pSVar1->key);
      } while (0 < iVar3);
      if (pSVar1 == (_StdResConnTableEntry *)0x0 || iVar3 != 0) {
        elem->next = pSVar1;
        pSVar7->next = elem;
        goto LAB_0012717a;
      }
      pcVar4 = elem->value;
      pcVar6 = pSVar1->value;
      __format = "ERROR duplicate key: InsertInStdResConnTable(\"%s\", \"%s\") -- old(\"%s\" @%d)\n"
      ;
    }
    iVar3 = 0;
    fprintf(_stderr,__format,__s1,pcVar4,pcVar6,uVar8);
  }
  return iVar3;
}

Assistant:

int InsertInStdResConnTable(StdResConnTableEntry_t *elem) {
   int r = 0, h = 0, rc = 1;
   StdResConnTableEntry_t *t = NULL;

   h = HashInStdResTbl(elem->key);
   t = StdResTblBucket[h];

   if (t == NULL) {           /* nothing else stored at this h value yet   */
           elem->next = NULL; /* the cdr of the new list is Z              */
      StdResTblBucket[h] = elem; /* store the element at the head of the list */
   }
   else if ((r = strcmp(elem->key, t->key)) > 0) { /* key(e) > key(t), look further down list */

      while (t->next && (r = strcmp(elem->key, t->next->key)) > 0) {
	 t = t->next;
      }

      if ((t->next == NULL) || (r != 0)) { /* hook elem in after t and before t->next */
	 elem->next = t->next;
	    t->next = elem;
      }
      else {
	 fprintf(stderr, "ERROR duplicate key: InsertInStdResConnTable(\"%s\", \"%s\") -- old(\"%s\" @%d)\n",
	       elem->key, elem->value, t->next->value, h);
	 rc = 0;
      }
   }
   else if (r < 0) {       /* the element comes ahead of the first list element */
           elem->next = t;    /* the cdr of the new list is the old list   */
      StdResTblBucket[h] = elem; /* store the element at the head of the list */
   }
   else { /* duplicate */
      fprintf(stderr, "ERROR duplicate key: InsertInStdResConnTable(\"%s\", \"%s\") - old(\"%s\" @%d)\n",
	    elem->key, elem->value, t->value, h);
      rc = 0;
   }
   return rc;
}